

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1M1P<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  undefined8 *puVar1;
  iterator __position;
  undefined8 uVar2;
  undefined8 uVar3;
  Matrix<float,_4,_4,_1,_4,_4> *dst;
  undefined1 auVar4 [8];
  PointerType ptr;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar5;
  long lVar6;
  ostream *poVar7;
  float *pfVar8;
  XprTypeNested s;
  Scalar SVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Matrix<float,_4,_1,_0,_4,_1> PiU;
  Matrix<float,_4,_4,_0,_4,_4> TV1;
  Matrix<float,_6,_6,_0,_6,_6> TuL1;
  Matrix<float,_4,_4,_0,_4,_4> TV2;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  predTrans;
  Matrix<float,_4,_1,_0,_4,_1> NuU;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines1;
  Matrix<float,_4,_4,_0,_4,_4> Tu1;
  Matrix<float,_6,_6,_0,_6,_6> TUL2;
  Matrix<float,_4,_1,_0,_4,_1> Pi;
  Matrix<float,_6,_6,_0,_6,_6> TuL2;
  Matrix<float,_6,_6,_0,_6,_6> TUL1;
  Matrix<float,_4,_4,_0,_4,_4> Tu2;
  Matrix<float,_4,_4,_0,_4,_4> sol;
  Matrix<float,_4,_1,_0,_4,_1> Nu;
  Matrix<float,_4,_4,_0,_4,_4> TU2;
  SrcEvaluatorType srcEvaluator_5;
  Matrix<float,_4,_4,_0,_4,_4> TU1;
  Matrix<float,_3,_3,_0,_3,_3> V1;
  Matrix<float,_3,_3,_0,_3,_3> V2;
  Scalar local_82c;
  undefined1 local_828 [8];
  float fStack_820;
  float fStack_81c;
  undefined1 local_818 [8];
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  undefined1 local_7f8 [8];
  undefined8 uStack_7f0;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  undefined1 local_7d8 [24];
  undefined8 uStack_7c0;
  float local_7b8 [8];
  float *local_798;
  Matrix<float,_4,_4,_1,_4,_4> *local_790;
  float *local_788;
  undefined8 local_780;
  float local_770;
  float local_76c;
  float local_768;
  float local_764;
  float local_760;
  float local_75c;
  float local_758;
  float local_754;
  float local_750;
  float local_74c;
  float local_748;
  Scalar local_744;
  Scalar local_740;
  Scalar local_73c;
  undefined1 local_738 [16];
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  float fStack_700;
  float fStack_6fc;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  undefined4 uStack_6b8;
  undefined4 local_6b4;
  undefined4 uStack_6b0;
  undefined4 local_6ac;
  undefined1 local_6a8 [8];
  float fStack_6a0;
  float fStack_69c;
  undefined1 local_698 [8];
  undefined8 uStack_690;
  undefined1 local_688 [8];
  float fStack_680;
  float fStack_67c;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined1 local_668 [12];
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  long local_650;
  float afStack_648 [10];
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_620;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_5f8 [16];
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  local_5d0;
  undefined8 local_5b8;
  undefined4 uStack_5b0;
  undefined8 uStack_5ac;
  undefined4 local_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined4 local_590;
  long local_58c;
  float fStack_584;
  float fStack_580;
  undefined4 local_57c;
  undefined1 local_578 [12];
  float fStack_56c;
  float fStack_568;
  float local_564;
  float local_560;
  float fStack_55c;
  undefined8 uStack_558;
  float afStack_550 [11];
  Matrix<float,_3,_3,_0,_3,_3> MStack_524;
  float fStack_500;
  float fStack_4fc;
  float fStack_4f8;
  float local_4f4;
  float fStack_4f0;
  float local_4ec;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  undefined8 uStack_4c0;
  undefined1 local_4b8 [8];
  undefined8 uStack_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  variable_if_dynamic<long,__1> vStack_460;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  PointerType local_438 [3];
  Scalar local_420;
  Scalar local_41c;
  undefined1 local_418 [4];
  float fStack_414;
  undefined1 auStack_410 [8];
  variable_if_dynamic<long,__1> vStack_408;
  undefined8 local_400;
  variable_if_dynamic<long,__1> vStack_3f8;
  variable_if_dynamic<long,__1> vStack_3f0;
  undefined8 local_3e8;
  float fStack_3e0;
  undefined8 uStack_3dc;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 local_3cc;
  undefined4 uStack_3c8;
  undefined4 local_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 local_394;
  undefined4 uStack_390;
  undefined4 local_38c;
  undefined1 local_388 [28];
  undefined4 uStack_36c;
  variable_if_dynamic<long,__1> vStack_368;
  undefined8 uStack_360;
  undefined8 local_358;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  float fStack_338;
  undefined1 auStack_334 [8];
  float fStack_32c;
  undefined8 uStack_328;
  undefined8 local_320;
  float local_318;
  float local_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float local_304;
  float fStack_300;
  float local_2fc;
  Matrix<float,_4,_4,_0,_4,_4> local_2f8;
  undefined1 local_2b8 [16];
  assign_op<float,_float> *local_2a8;
  assign_op<float,_float> *paStack_2a0;
  float local_298 [2];
  float afStack_290 [2];
  float local_288 [2];
  float afStack_280 [2];
  SrcEvaluatorType local_278;
  Matrix<float,_4,_4,_0,_4,_4> local_268;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>
  local_188;
  Matrix<float,_4,_4,_0,_4,_4> local_158;
  Matrix<float,_4,_4,_0,_4,_4> *local_110 [4];
  float local_ec [9];
  Matrix<float,_3,_1,_0,_3,_1> local_c8;
  Matrix<float,_3,_1,_0,_3,_1> local_bc;
  Matrix<float,_3,_1,_0,_3,_1> local_b0;
  Matrix<float,_3,_1,_0,_3,_1> local_a4;
  PointerType local_98 [2];
  PointerType local_88 [2];
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_78;
  
  pfVar8 = *(float **)lCPair;
  if ((*(float **)(lCPair + 8) == pfVar8) &&
     ((ulong)(*(long *)(plPair + 8) - *(long *)plPair) < 0x21)) {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Solver 1M1P requires at least 1 line and 1 plane correspondence!");
    std::endl<char,std::char_traits<char>>(poVar7);
    exit(-1);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  puVar1 = *(undefined8 **)plPair;
  local_438[0] = (PointerType)*puVar1;
  local_438[1]._0_4_ = *(float *)((long)(puVar1 + 1) + 0);
  local_438[1]._4_4_ = *(float *)((long)(puVar1 + 1) + 4);
  local_278.super_block_evaluator<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_4,_4>_>
  .m_data = (PointerType)puVar1[2];
  local_278.super_block_evaluator<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_4,_4>_>
  ._8_4_ = *(float *)((long)(puVar1 + 3) + 0);
  local_278.super_block_evaluator<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_4,_4>_>
  ._12_4_ = *(float *)((long)(puVar1 + 3) + 4);
  local_78.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._0_8_ = *(undefined8 *)pfVar8;
  local_78.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._8_8_ = *(undefined8 *)(pfVar8 + 2);
  local_78.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar8 + 4);
  local_78.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar8 + 6);
  local_78.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar8 + 8);
  local_78.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar8 + 10);
  local_78.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._0_8_ = *(undefined8 *)(pfVar8 + 0xc);
  local_78.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._8_8_ = *(undefined8 *)(pfVar8 + 0xe);
  getPluckerCoord<float>(&local_5d0,&local_78);
  local_388._0_8_ = local_438;
  local_388._8_4_ = 4.2039e-45;
  local_388._12_4_ = 0.0;
  vStack_368.m_value = 0;
  local_358 = 4;
  fStack_350 = SUB84(local_5d0.
                     super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,0);
  fStack_34c = (float)((ulong)local_5d0.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 0x20);
  fStack_348 = 4.2039e-45;
  fStack_344 = 0.0;
  stack0xfffffffffffffcd0 = 0;
  local_320 = 6;
  local_560 = fStack_350;
  fStack_55c = fStack_34c;
  fStack_338 = fStack_350;
  auStack_334._0_4_ = fStack_34c;
  unique0x10004ab0 = (XprTypeNested)local_388._0_8_;
  unique0x10004ae0 = (XprTypeNested)local_388._0_8_;
  SVar9 = Eigen::internal::
          redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>const,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
          ::
          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                    ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                      *)local_578,(scalar_sum_op<float,_float> *)local_738,
                     (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                      *)local_388);
  if (ABS(SVar9) < 1e-06) {
LAB_001ac482:
    if (local_5d0.
        super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5d0.
                      super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_5d0.
                            super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_5d0.
                            super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_88[0] = local_438[0];
  local_88[1] = local_438[1];
  local_98[0] = local_278.
                super_block_evaluator<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
                super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_4,_4>_>
                .m_data;
  local_98[1] = (PointerType)
                local_278.
                super_block_evaluator<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
                super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_4,_4>_>
                ._8_8_;
  getPredefinedTransformations1Plane3Line<float>
            (&local_620,(Matrix<float,_4,_1,_0,_4,_1> *)local_88,
             (Matrix<float,_4,_1,_0,_4,_1> *)local_98,false);
  local_268.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          local_620.
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
  local_268.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_
       = *(undefined8 *)
          (local_620.
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
  local_268.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _16_8_ = *(undefined8 *)
            (local_620.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4)
  ;
  local_268.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _24_8_ = *(undefined8 *)
            (local_620.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6)
  ;
  local_268.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _32_8_ = *(undefined8 *)
            (local_620.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8)
  ;
  local_268.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _40_8_ = *(undefined8 *)
            (local_620.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10
            );
  uVar2 = *(undefined8 *)
           (local_620.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc
           );
  uVar3 = *(undefined8 *)
           (local_620.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe
           );
  local_268.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc]
       = (float)uVar2;
  local_268.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
       = (float)((ulong)uVar2 >> 0x20);
  local_268.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
       = (float)uVar3;
  local_268.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
       = (float)((ulong)uVar3 >> 0x20);
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          local_620.
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-2].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_
       = *(undefined8 *)
          (local_620.
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _16_8_ = *(undefined8 *)
            (local_620.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4)
  ;
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _24_8_ = *(undefined8 *)
            (local_620.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6)
  ;
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _32_8_ = *(undefined8 *)
            (local_620.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8)
  ;
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _40_8_ = *(undefined8 *)
            (local_620.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10
            );
  uVar2 = *(undefined8 *)
           (local_620.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-2].
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc
           );
  uVar3 = *(undefined8 *)
           (local_620.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-2].
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe
           );
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc]
       = (float)uVar2;
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
       = (float)((ulong)uVar2 >> 0x20);
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
       = (float)uVar3;
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
       = (float)((ulong)uVar3 >> 0x20);
  local_388._0_4_ = 1.0;
  local_388._4_4_ = 0.0;
  local_388._8_4_ = 0.0;
  local_388._12_4_ = 0.0;
  local_388._16_4_ = 0.0;
  local_388._20_4_ = 0.0;
  local_388._24_4_ = 0;
  uStack_36c = 0x3f800000;
  vStack_368.m_value = 0;
  uStack_360 = 0;
  local_358 = 0;
  fStack_350 = 1.0;
  fStack_34c = 0.0;
  fStack_348 = 0.0;
  fStack_344 = 0.0;
  uStack_340 = 0;
  uStack_33c = 0;
  fStack_338 = 0.0;
  auStack_334._0_4_ = 1.0;
  stack0xfffffffffffffcd0 = 0;
  uStack_328 = 0;
  local_320 = 0;
  local_318 = 1.0;
  local_314 = 0.0;
  fStack_310 = 0.0;
  fStack_30c = 0.0;
  fStack_308 = 0.0;
  local_304 = 0.0;
  fStack_300 = 0.0;
  local_2fc = 1.0;
  local_578._0_4_ = 1.0;
  local_578._4_4_ = 0.0;
  local_578._8_4_ = 0.0;
  fStack_56c = 0.0;
  fStack_568 = 0.0;
  local_564 = 0.0;
  local_560 = 0.0;
  fStack_55c = 1.0;
  uStack_558 = 0;
  afStack_550[0] = 0.0;
  afStack_550[1] = 0.0;
  afStack_550[2] = 0.0;
  afStack_550[3] = 0.0;
  afStack_550[4] = 1.0;
  afStack_550[5] = 0.0;
  afStack_550[6] = 0.0;
  afStack_550[7] = 0.0;
  afStack_550[8] = 0.0;
  afStack_550[9] = 0.0;
  afStack_550[10] = 0.0;
  MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       1.0;
  MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  fStack_500 = 0.0;
  fStack_4fc = 0.0;
  fStack_4f8 = 0.0;
  local_4f4 = 0.0;
  fStack_4f0 = 0.0;
  local_4ec = 1.0;
  local_738._8_4_ = 4.2039e-45;
  local_738._12_4_ = 0.0;
  local_728._0_4_ = 4.2039e-45;
  local_728._4_4_ = 0.0;
  local_718 = 0;
  uStack_710 = (XprTypeNested)0x0;
  local_708 = 6;
  vStack_408.m_value = (long)&local_2f8;
  local_620.
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_620.
       super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -2;
  local_7d8._0_8_ = &local_158;
  _local_418 = (non_const_type)&local_5b8;
  auStack_410 = (undefined1  [8])local_7d8;
  local_400 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)local_738;
  local_738._0_8_ = (XprTypeNested)local_388;
  uStack_720 = (long)local_388;
  local_5b8 = (XprTypeNested)local_388;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_418);
  local_738._0_8_ = auStack_334;
  local_738._8_4_ = 4.2039e-45;
  local_738._12_4_ = 0.0;
  local_728._0_4_ = 4.2039e-45;
  local_728._4_4_ = 0.0;
  local_718 = 3;
  uStack_710 = (XprTypeNested)0x3;
  local_708 = 6;
  local_7d8._0_8_ = &local_158;
  _local_418 = (non_const_type)&local_5b8;
  auStack_410 = (undefined1  [8])local_7d8;
  local_400 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)local_738;
  local_5b8 = (XprTypeNested)local_738._0_8_;
  vStack_408.m_value = (long)&local_2f8;
  uStack_720 = (long)local_388;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_418);
  local_a4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_158.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_a4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_158.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  local_a4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_158.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_7d8,&local_a4);
  _local_418 = (non_const_type)(local_388 + 0xc);
  local_708 = 0;
  fStack_700 = 0.0;
  fStack_6fc = 0.0;
  uStack_710 = &local_158;
  uStack_720._0_4_ = 4.2039e-45;
  uStack_720._4_4_ = 0.0;
  local_718 = 3;
  local_6f8._0_4_ = 4;
  local_6f8._4_4_ = 0;
  auStack_410._0_4_ = 3;
  auStack_410._4_4_ = 0;
  vStack_408.m_value._0_4_ = 3;
  vStack_408.m_value._4_4_ = 0;
  vStack_3f8.m_value = 3;
  vStack_3f0.m_value = 0;
  local_3e8 = 6;
  local_728 = uStack_710;
  local_738._0_8_ = (Matrix<float,_3,_3,_0,_3,_3> *)local_7d8;
  local_400 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)local_388;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<float,float>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)local_418,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)local_738,(assign_op<float,_float> *)&local_5b8,(type)0x0);
  local_738._8_4_ = 4.2039e-45;
  local_738._12_4_ = 0.0;
  local_728._0_4_ = 4.2039e-45;
  local_728._4_4_ = 0.0;
  local_718 = 0;
  uStack_710 = (XprTypeNested)0x0;
  local_708 = 6;
  local_7d8._0_8_ = &local_268;
  _local_418 = (non_const_type)&local_5b8;
  local_400 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)local_738;
  local_738._0_8_ = (XprTypeNested)local_578;
  vStack_408.m_value = (long)&local_2f8;
  auStack_410 = (undefined1  [8])local_7d8;
  uStack_720 = (long)local_578;
  local_5b8 = (XprTypeNested)local_578;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_418);
  local_738._0_8_ = &MStack_524;
  local_738._8_4_ = 4.2039e-45;
  local_738._12_4_ = 0.0;
  local_728._0_4_ = 4.2039e-45;
  local_728._4_4_ = 0.0;
  local_718 = 3;
  uStack_710 = (XprTypeNested)0x3;
  local_708 = 6;
  local_7d8._0_8_ = &local_268;
  _local_418 = (non_const_type)&local_5b8;
  local_400 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)local_738;
  local_5b8 = (XprTypeNested)local_738._0_8_;
  vStack_408.m_value = (long)&local_2f8;
  auStack_410 = (undefined1  [8])local_7d8;
  uStack_720 = (long)local_578;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_418);
  local_b0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_268.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_b0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_268.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  local_b0.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_268.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_7d8,&local_b0);
  _local_418 = (non_const_type)&fStack_56c;
  local_708 = 0;
  fStack_700 = 0.0;
  fStack_6fc = 0.0;
  uStack_710 = &local_268;
  uStack_720._0_4_ = 4.2039e-45;
  uStack_720._4_4_ = 0.0;
  local_718 = 3;
  local_6f8._0_4_ = 4;
  local_6f8._4_4_ = 0;
  auStack_410._0_4_ = 3;
  auStack_410._4_4_ = 0;
  vStack_408.m_value._0_4_ = 3;
  vStack_408.m_value._4_4_ = 0;
  vStack_3f8.m_value = 3;
  vStack_3f0.m_value = 0;
  local_3e8 = 6;
  local_738._0_8_ = (Matrix<float,_3,_3,_0,_3,_3> *)local_7d8;
  local_728 = uStack_710;
  local_400 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)local_578;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<float,float>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)local_418,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)local_738,(assign_op<float,_float> *)&local_5b8,(type)0x0);
  fVar12 = ((local_5d0.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_448 = fVar12 * (float)local_388._0_4_;
  fStack_444 = fVar12 * (float)local_388._4_4_;
  fStack_440 = fVar12 * (float)local_388._8_4_;
  fStack_43c = fVar12 * (float)local_388._12_4_;
  local_750 = ((local_5d0.
                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
  ;
  fVar13 = ((local_5d0.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  local_4e8 = CONCAT44(fVar13 * local_358._4_4_,fVar13 * (float)local_358);
  uStack_4e0 = CONCAT44(fVar13 * fStack_34c,fVar13 * fStack_350);
  fVar14 = ((local_5d0.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  fVar15 = ((local_5d0.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  local_4a8 = fVar15 * (float)uStack_328;
  fStack_4a4 = fVar15 * uStack_328._4_4_;
  fStack_4a0 = fVar15 * (float)local_320;
  fStack_49c = fVar15 * local_320._4_4_;
  local_75c = ((local_5d0.
                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
  ;
  local_478 = (float)local_388._16_4_ * fVar12;
  local_488 = (float)uStack_360 * local_750;
  local_748 = fStack_348 * fVar13;
  _local_818 = ZEXT416((uint)((float)auStack_334._4_4_ * fVar14));
  local_74c = local_318 * fVar15;
  local_754 = fStack_300 * local_75c;
  _local_608 = ZEXT416((uint)(fVar12 * (float)local_388._20_4_));
  _local_4c8 = ZEXT416((uint)local_750);
  local_750 = uStack_360._4_4_ * local_750;
  _local_698 = ZEXT416((uint)(fVar13 * fStack_344));
  local_198 = ZEXT416((uint)fVar14);
  _local_688 = ZEXT416((uint)(fStack_32c * fVar14));
  _local_6a8 = ZEXT416((uint)(fVar15 * local_314));
  _local_4b8 = ZEXT416((uint)local_75c);
  local_75c = local_2fc * local_75c;
  fVar12 = local_5d0.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  local_498 = fVar12 * (float)local_578._0_4_;
  fStack_494 = fVar12 * (float)local_578._4_4_;
  fStack_490 = fVar12 * (float)local_578._8_4_;
  fStack_48c = fVar12 * fStack_56c;
  fVar13 = local_5d0.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  local_1b8 = fVar13 * afStack_550[2];
  fStack_1b4 = fVar13 * afStack_550[3];
  fStack_1b0 = fVar13 * afStack_550[4];
  fStack_1ac = fVar13 * afStack_550[5];
  fVar14 = local_5d0.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  local_1a8 = fVar14 * MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[3];
  fStack_1a4 = fVar14 * MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[4];
  fStack_1a0 = fVar14 * MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[5];
  fStack_19c = fVar14 * MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[6];
  local_4d8 = fStack_568 * fVar12;
  local_768 = local_5d0.
              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  local_758 = afStack_550[0] * local_768;
  local_760 = afStack_550[6] * fVar13;
  fVar15 = local_5d0.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  _local_828 = ZEXT416((uint)(MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                              .m_storage.m_data.array[1] * fVar15));
  local_764 = MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] * fVar14;
  _local_7f8 = ZEXT416((uint)(fVar12 * local_564));
  local_770 = local_5d0.
              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  local_76c = fStack_4f0 * local_770;
  _local_458 = ZEXT416((uint)(fVar13 * afStack_550[7]));
  local_1d8 = ZEXT416((uint)local_768);
  local_768 = afStack_550[1] * local_768;
  _local_468 = ZEXT416((uint)(fVar14 * MStack_524.
                                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                       m_storage.m_data.array[8]));
  local_1c8 = ZEXT416((uint)fVar15);
  local_5f8 = ZEXT416((uint)(MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[2] * fVar15));
  local_1e8 = ZEXT416((uint)local_770);
  local_770 = local_4ec * local_770;
  auStack_410 = (undefined1  [8])local_438;
  local_228 = CONCAT44(uStack_36c,local_388._24_4_);
  uStack_220 = vStack_368.m_value;
  local_218 = CONCAT44(uStack_33c,uStack_340);
  uStack_210 = CONCAT44(auStack_334._0_4_,fStack_338);
  local_7e8 = fStack_310;
  fStack_7e4 = fStack_30c;
  fStack_7e0 = fStack_308;
  fStack_7dc = local_304;
  local_208 = CONCAT44(fStack_55c,local_560);
  _fStack_200 = uStack_558;
  local_1f8 = CONCAT44(afStack_550[9],afStack_550[8]);
  uStack_1f0 = CONCAT44(MStack_524.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[0],afStack_550[10]);
  local_678 = CONCAT44(fStack_4fc,fStack_500);
  uStack_670 = CONCAT44(local_4f4,fStack_4f8);
  _local_418 = &local_158;
  Eigen::internal::
  Assignment<Eigen::Matrix<float,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<float,_4,_4,_1,_4,_4> *)local_738,(SrcXprType *)local_418,
        (assign_op<float,_float> *)local_7d8);
  local_6e0 = 4;
  dst = (Matrix<float,_4,_4,_1,_4,_4> *)local_738;
  local_6f8 = auStack_410;
  uStack_6e8 = auStack_410;
  if (((ulong)auStack_410 & 0xf) == 0) {
    dst = (Matrix<float,_4,_4,_1,_4,_4> *)local_738;
    local_808 = (float)local_738._12_4_ * *(float *)((long)auStack_410 + 0xc) +
                (float)local_738._4_4_ * *(float *)((long)auStack_410 + 4) +
                (float)local_738._8_4_ * *(float *)((long)auStack_410 + 8) +
                (float)local_738._0_4_ * *(float *)auStack_410;
    fStack_804 = uStack_720._4_4_ * *(float *)((long)auStack_410 + 0xc) +
                 local_728._4_4_ * *(float *)((long)auStack_410 + 4) +
                 (float)uStack_720 * *(float *)((long)auStack_410 + 8) +
                 (float)local_728 * *(float *)auStack_410;
    fStack_800 = uStack_710._4_4_ * *(float *)((long)auStack_410 + 0xc) +
                 local_718._4_4_ * *(float *)((long)auStack_410 + 4) +
                 (float)uStack_710 * *(float *)((long)auStack_410 + 8) +
                 (float)local_718 * *(float *)auStack_410;
    fStack_7fc = fStack_6fc * *(float *)((long)auStack_410 + 0xc) +
                 local_708._4_4_ * *(float *)((long)auStack_410 + 4) +
                 fStack_700 * *(float *)((long)auStack_410 + 8) +
                 (float)local_708 * *(float *)auStack_410;
    _local_418 = &local_268;
    auVar4 = (undefined1  [8])&local_278;
    local_6f0 = (Matrix<float,_4,_4,_1,_4,_4> *)local_738;
    Eigen::internal::
    Assignment<Eigen::Matrix<float,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
    ::run(dst,(SrcXprType *)local_418,(assign_op<float,_float> *)local_7d8);
    auStack_410 = auVar4;
    local_6e0 = 4;
    local_6f8 = auStack_410;
    uStack_6e8 = auStack_410;
    if (((ulong)auStack_410 & 0xf) == 0) {
      fVar12 = local_7e8 * (float)local_4b8._0_4_ +
               (float)local_218 * (float)local_198._0_4_ +
               local_448 + (float)local_228 * (float)local_4c8._0_4_ + (float)local_4e8 + local_4a8;
      fVar13 = fStack_7e4 * (float)local_4b8._0_4_ +
               local_218._4_4_ * (float)local_198._0_4_ +
               fStack_444 + local_228._4_4_ * (float)local_4c8._0_4_ + local_4e8._4_4_ + fStack_4a4;
      fVar14 = fStack_7e0 * (float)local_4b8._0_4_ +
               (float)uStack_210 * (float)local_198._0_4_ +
               fStack_440 + (float)uStack_220 * (float)local_4c8._0_4_ + (float)uStack_4e0 +
               fStack_4a0;
      local_448 = fStack_7dc * (float)local_4b8._0_4_ +
                  uStack_210._4_4_ * (float)local_198._0_4_ +
                  fStack_43c + uStack_220._4_4_ * (float)local_4c8._0_4_ + uStack_4e0._4_4_ +
                  fStack_49c;
      local_818._0_4_ =
           (float)local_818._0_4_ + local_74c + local_754 + local_478 + local_488 + local_748;
      local_688._0_4_ =
           (float)local_688._0_4_ + (float)local_6a8._0_4_ + local_75c +
           (float)local_608._0_4_ + local_750 + (float)local_698._0_4_;
      fVar15 = (float)local_678 * (float)local_1e8._0_4_ +
               (float)local_1f8 * (float)local_1c8._0_4_ +
               local_498 + (float)local_208 * (float)local_1d8._0_4_ + local_1b8 + local_1a8;
      local_608._4_4_ =
           local_678._4_4_ * (float)local_1e8._0_4_ +
           local_1f8._4_4_ * (float)local_1c8._0_4_ +
           fStack_494 + local_208._4_4_ * (float)local_1d8._0_4_ + fStack_1b4 + fStack_1a4;
      fVar16 = (float)uStack_670 * (float)local_1e8._0_4_ +
               (float)uStack_1f0 * (float)local_1c8._0_4_ +
               fStack_490 + fStack_200 * (float)local_1d8._0_4_ + fStack_1b0 + fStack_1a0;
      local_4a8 = uStack_670._4_4_ * (float)local_1e8._0_4_ +
                  uStack_1f0._4_4_ * (float)local_1c8._0_4_ +
                  fStack_48c + fStack_1fc * (float)local_1d8._0_4_ + fStack_1ac + fStack_19c;
      local_828._0_4_ =
           (float)local_828._0_4_ + local_764 + local_76c + local_4d8 + local_758 + local_760;
      local_5f8._0_4_ =
           (float)local_5f8._0_4_ + (float)local_468._0_4_ + local_770 +
           (float)local_7f8._0_4_ + local_768 + (float)local_458._0_4_;
      local_6a8._4_4_ =
           (float)local_738._12_4_ * *(float *)((long)auStack_410 + 0xc) +
           (float)local_738._4_4_ * *(float *)((long)auStack_410 + 4);
      local_5e8 = (float)local_6a8._4_4_ +
                  (float)local_738._8_4_ * *(float *)((long)auStack_410 + 8) +
                  (float)local_738._0_4_ * *(float *)auStack_410;
      local_7f8._4_4_ =
           uStack_720._4_4_ * *(float *)((long)auStack_410 + 0xc) +
           local_728._4_4_ * *(float *)((long)auStack_410 + 4);
      fStack_5e4 = (float)local_7f8._4_4_ +
                   (float)uStack_720 * *(float *)((long)auStack_410 + 8) +
                   (float)local_728 * *(float *)auStack_410;
      local_698._4_4_ =
           uStack_710._4_4_ * *(float *)((long)auStack_410 + 0xc) +
           local_718._4_4_ * *(float *)((long)auStack_410 + 4);
      fStack_5e0 = (float)local_698._4_4_ +
                   (float)uStack_710 * *(float *)((long)auStack_410 + 8) +
                   (float)local_718 * *(float *)auStack_410;
      fStack_5dc = fStack_6fc * *(float *)((long)auStack_410 + 0xc) +
                   local_708._4_4_ * *(float *)((long)auStack_410 + 4) +
                   fStack_700 * *(float *)((long)auStack_410 + 8) +
                   (float)local_708 * *(float *)auStack_410;
      local_608._0_4_ = local_608._4_4_;
      fStack_600 = (float)local_608._4_4_;
      fStack_5fc = (float)local_608._4_4_;
      local_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
           = fStack_804 * fVar13 + fVar14 * fStack_800 + fVar12 * local_808;
      _local_7e8 = CONCAT44(fVar13,fVar12);
      _fStack_7e0 = CONCAT44(local_448,fVar14);
      local_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           = ((fStack_804 * (float)local_688._0_4_ - (float)local_818._0_4_ * fStack_800) -
             fVar12 * fStack_7fc) /
             local_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[2];
      local_458._4_4_ = fVar13;
      local_458._0_4_ = fVar13;
      fStack_450 = fVar13;
      fStack_44c = fVar13;
      local_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
           = ((fStack_800 * local_448 - (float)local_688._0_4_ * local_808) - fVar13 * fStack_7fc) /
             local_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[2];
      local_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
           = ((local_808 * (float)local_818._0_4_ - local_448 * fStack_804) - fVar14 * fStack_7fc) /
             local_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[2];
      local_6a8._0_4_ =
           fStack_5e0 * fVar16 + fStack_5e4 * (float)local_608._4_4_ + local_5e8 * fVar15;
      local_678 = CONCAT44(local_608._4_4_,fVar15);
      uStack_670 = CONCAT44(local_4a8,fVar16);
      local_7f8._0_4_ =
           ((fStack_5e4 * (float)local_5f8._0_4_ - (float)local_828._0_4_ * fStack_5e0) -
           fStack_5dc * fVar15) / (float)local_6a8._0_4_;
      local_698._0_4_ =
           ((fStack_5e0 * local_4a8 - (float)local_5f8._0_4_ * local_5e8) -
           fStack_5dc * (float)local_608._4_4_) / (float)local_6a8._0_4_;
      local_6a8._0_4_ =
           ((local_5e8 * (float)local_828._0_4_ - local_4a8 * fStack_5e4) - fVar16 * fStack_5dc) /
           (float)local_6a8._0_4_;
      local_5b8._0_4_ = 0x3f800000;
      local_5b8._4_4_ = 0;
      uStack_5b0 = 0;
      uStack_5ac = 0;
      local_5a4 = 0x3f800000;
      local_5a0 = 0;
      uStack_598 = 0;
      local_590 = 0x3f800000;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = 1.0;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = 0.0;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = 0.0;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 0.0;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] = 0.0;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [5] = 1.0;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [6] = 0.0;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = 0.0;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [8] = 0.0;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [9] = 0.0;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = 1.0;
      local_738._0_4_ = 1.0;
      local_738._4_4_ = 0.0;
      local_738._8_4_ = 0.0;
      local_738._12_4_ = 0.0;
      local_728._0_4_ = 0.0;
      local_728._4_4_ = 0.0;
      uStack_720._0_4_ = 0.0;
      uStack_720._4_4_ = 1.0;
      local_718 = 0;
      uStack_710 = (Matrix<float,_4,_4,_0,_4,_4> *)0x0;
      local_708 = 0;
      fStack_700 = 1.0;
      fStack_6fc = 0.0;
      local_6f8._0_4_ = 0;
      local_6f8._4_4_ = 0;
      local_6f0._0_4_ = 0;
      local_6f0._4_4_ = 0;
      uStack_6e8._0_4_ = 0;
      uStack_6e8._4_4_ = 0x3f800000;
      local_6e0 = 0;
      uStack_6d8 = 0;
      local_6d0 = 0;
      local_6c8 = 0x3f800000;
      local_6c4 = 0;
      uStack_6c0 = 0;
      uStack_6bc = 0;
      uStack_6b8 = 0;
      local_418 = (undefined1  [4])0x3f800000;
      fStack_414 = 0.0;
      auStack_410._0_4_ = 0.0;
      auStack_410._4_4_ = 0.0;
      vStack_408.m_value._0_4_ = 0;
      vStack_408.m_value._4_4_ = 0;
      local_400._0_4_ = 0;
      local_400._4_4_ = 0x3f800000;
      vStack_3f8.m_value = 0;
      vStack_3f0.m_value = 0;
      local_3e8 = 0;
      fStack_3e0 = 1.0;
      uStack_3dc = 0;
      uStack_3d4 = 0;
      uStack_3d0 = 0;
      local_3cc = 0;
      uStack_3c8 = 0;
      local_3c4 = 0x3f800000;
      local_3c0 = 0;
      uStack_3b8 = 0;
      local_3b0 = 0;
      local_3a8 = 0x3f800000;
      local_3a4 = 0;
      uStack_3a0 = 0;
      uStack_39c = 0;
      uStack_398 = 0;
      local_57c = 0x3f800000;
      local_58c = (ulong)(uint)local_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[0] << 0x20;
      _fStack_584 = CONCAT44(local_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[2],
                             local_bc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[1]);
      local_6b4 = 0;
      uStack_6b0 = 0;
      local_394 = 0;
      uStack_390 = 0;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = 1.0;
      uStack_7f0._0_4_ = (float)local_7f8._4_4_;
      uStack_7f0._4_4_ = (float)local_7f8._4_4_;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
      _44_8_ = (ulong)(uint)local_7f8._0_4_ << 0x20;
      uStack_690._0_4_ = (float)local_698._4_4_;
      uStack_690._4_4_ = local_698._4_4_;
      fStack_6a0 = (float)local_6a8._4_4_;
      fStack_69c = (float)local_6a8._4_4_;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = (float)local_6a8._0_4_;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = (float)local_698._0_4_;
      local_6ac = 0x3f800000;
      local_38c = 0x3f800000;
      fStack_4a4 = local_4a8;
      fStack_4a0 = local_4a8;
      fStack_49c = local_4a8;
      fStack_444 = local_448;
      fStack_440 = local_448;
      fStack_43c = local_448;
      getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_668,&local_bc);
      local_110[0] = (Matrix<float,_4,_4,_0,_4,_4> *)(local_738 + 0xc);
      local_7d8._8_4_ = 4.2039e-45;
      local_7d8._12_4_ = 0.0;
      local_7d8._16_4_ = 4.2039e-45;
      local_7d8._20_4_ = 0.0;
      local_7b8[0] = 4.2039e-45;
      local_7b8[1] = 0.0;
      local_7b8[2] = 0.0;
      local_7b8[3] = 0.0;
      local_7b8[4] = 8.40779e-45;
      local_7b8[5] = 0.0;
      pfVar8 = (float *)local_110;
      uStack_7c0 = dst;
      local_2b8._0_8_ = pfVar8;
      local_2b8._8_8_ = &local_188;
      local_2a8 = (assign_op<float,_float> *)local_ec;
      paStack_2a0 = (assign_op<float,_float> *)local_7d8;
      local_188.m_lhs.m_lhs.m_lhs.m_lhs.m_rhs.m_xpr = (XprTypeNested)local_668;
      local_7d8._0_8_ = local_110[0];
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_2b8);
      local_c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           = (float)local_7f8._0_4_;
      local_c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
           = (float)local_698._0_4_;
      local_c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
           = (float)local_6a8._0_4_;
      getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_668,&local_c8);
      local_110[0] = (Matrix<float,_4,_4,_0,_4,_4> *)(auStack_410 + 4);
      local_7d8._8_4_ = 4.2039e-45;
      local_7d8._12_4_ = 0.0;
      local_7d8._16_4_ = 4.2039e-45;
      local_7d8._20_4_ = 0.0;
      local_7b8[0] = 4.2039e-45;
      local_7b8[1] = 0.0;
      local_7b8[2] = 0.0;
      local_7b8[3] = 0.0;
      local_7b8[4] = 8.40779e-45;
      local_7b8[5] = 0.0;
      uStack_7c0 = (Matrix<float,_4,_4,_1,_4,_4> *)local_418;
      local_2b8._0_8_ = pfVar8;
      local_2b8._8_8_ = &local_188;
      local_2a8 = (assign_op<float,_float> *)local_ec;
      paStack_2a0 = (assign_op<float,_float> *)local_7d8;
      local_188.m_lhs.m_lhs.m_lhs.m_lhs.m_rhs.m_xpr = (Matrix<float,_4,_4,_0,_4,_4> *)local_668;
      local_7d8._0_8_ = local_110[0];
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_2b8);
      local_6a8._4_4_ = local_7e8 * (float)local_738._4_4_;
      local_6a8._0_4_ = local_7e8 * (float)local_738._0_4_;
      fStack_6a0 = local_7e8 * (float)local_738._8_4_;
      fStack_69c = local_7e8 * (float)local_738._12_4_;
      local_468._4_4_ = uStack_720._4_4_;
      local_468._0_4_ = (float)uStack_720;
      vStack_460.m_value = local_718;
      local_698._4_4_ = local_6f0._4_4_;
      local_698._0_4_ = (undefined4)local_6f0;
      uStack_690._4_4_ = uStack_6e8._4_4_;
      uStack_690._0_4_ = (float)(undefined4)uStack_6e8;
      local_7f8._4_4_ = uStack_6bc;
      local_7f8._0_4_ = uStack_6c0;
      uStack_7f0._4_4_ = (float)local_6b4;
      uStack_7f0._0_4_ = (float)uStack_6b8;
      local_7e8 = fStack_7e0 * (float)local_708;
      fStack_7e4 = fStack_7e0 * local_708._4_4_;
      fStack_7dc = fStack_7e0 * fStack_6fc;
      fStack_810 = (float)local_818._0_4_ * (float)local_6d0;
      fStack_80c = (float)local_818._0_4_ * local_6d0._4_4_;
      local_818._4_4_ = (float)local_818._0_4_ * uStack_6d8._4_4_;
      local_818._0_4_ = (float)local_818._0_4_ * (float)uStack_6d8;
      local_4d8 = (float)local_678 * (float)local_418;
      fStack_4d4 = (float)local_678 * fStack_414;
      fStack_4d0 = (float)local_678 * (float)auStack_410._0_4_;
      fStack_4cc = (float)local_678 * (float)auStack_410._4_4_;
      local_4e8 = CONCAT44(local_400._4_4_,(undefined4)local_400);
      uStack_4e0 = vStack_3f8.m_value;
      local_4c8._4_4_ = local_3cc;
      local_4c8._0_4_ = uStack_3d0;
      uStack_4c0._4_4_ = local_3c4;
      uStack_4c0._0_4_ = (float)uStack_3c8;
      local_678 = CONCAT44((float)uStack_670 * local_3e8._4_4_,(float)uStack_670 * (float)local_3e8)
      ;
      uStack_670 = CONCAT44((float)uStack_670 * (float)uStack_3dc,(float)uStack_670 * fStack_3e0);
      local_4b8._4_4_ = uStack_39c;
      local_4b8._0_4_ = uStack_3a0;
      uStack_4b0._4_4_ = local_394;
      uStack_4b0._0_4_ = (float)uStack_398;
      fStack_820 = (float)local_828._0_4_ * (float)local_3b0;
      fStack_81c = (float)local_828._0_4_ * local_3b0._4_4_;
      local_828._4_4_ = (float)local_828._0_4_ * uStack_3b8._4_4_;
      local_828._0_4_ = (float)local_828._0_4_ * (float)uStack_3b8;
      unique0x00004e80 = &local_808;
      fStack_7e0 = fStack_7e0 * fStack_700;
      local_668._0_8_ = (non_const_type)&local_5b8;
      Eigen::internal::
      Assignment<Eigen::Matrix<float,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<float,_4,_4,_1,_4,_4> *)local_7d8,(SrcXprType *)local_668,
            (assign_op<float,_float> *)local_2b8);
      dst = (Matrix<float,_4,_4,_1,_4,_4> *)CONCAT44(local_6f0._4_4_,(undefined4)local_6f0);
      local_798 = stack0xfffffffffffff9a0;
      local_780 = 4;
      local_790 = (Matrix<float,_4,_4,_1,_4,_4> *)local_7d8;
      local_788 = local_798;
      if (((ulong)stack0xfffffffffffff9a0 & 0xf) == 0) {
        local_478 = *stack0xfffffffffffff9a0;
        fStack_474 = stack0xfffffffffffff9a0[1];
        fStack_470 = stack0xfffffffffffff9a0[2];
        fStack_46c = stack0xfffffffffffff9a0[3];
        local_498 = (float)local_7d8._0_4_ * local_478;
        fStack_494 = (float)local_7d8._4_4_ * fStack_474;
        fStack_490 = (float)local_7d8._8_4_ * fStack_470;
        fStack_48c = (float)local_7d8._12_4_ * fStack_46c;
        local_488 = (float)local_7d8._16_4_ * local_478;
        fStack_484 = (float)local_7d8._20_4_ * fStack_474;
        fStack_480 = (float)uStack_7c0 * fStack_470;
        fStack_47c = uStack_7c0._4_4_ * fStack_46c;
        local_478 = local_478 * local_7b8[0];
        fStack_474 = fStack_474 * local_7b8[1];
        fStack_470 = fStack_470 * local_7b8[2];
        fStack_46c = fStack_46c * local_7b8[3];
        unique0x00005300 = &local_5e8;
        local_668._0_8_ = &local_2f8;
        Eigen::internal::
        Assignment<Eigen::Matrix<float,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<float,_4,_4,_1,_4,_4> *)local_7d8,(SrcXprType *)local_668,
              (assign_op<float,_float> *)local_2b8);
        dst = (Matrix<float,_4,_4,_1,_4,_4> *)CONCAT44(local_6f0._4_4_,(undefined4)local_6f0);
        local_798 = stack0xfffffffffffff9a0;
        local_788 = stack0xfffffffffffff9a0;
        local_780 = 4;
        local_790 = (Matrix<float,_4,_4,_1,_4,_4> *)local_7d8;
        if (((ulong)stack0xfffffffffffff9a0 & 0xf) == 0) {
          fVar16 = (float)local_7f8._0_4_ * (float)local_688._0_4_ +
                   (float)local_698._0_4_ * local_448 +
                   (float)local_6a8._0_4_ + (float)local_468._0_4_ * (float)local_458._0_4_ +
                   local_7e8 + (float)local_818._0_4_;
          fVar10 = (float)local_7f8._4_4_ * (float)local_688._0_4_ +
                   (float)local_698._4_4_ * fStack_444 +
                   (float)local_6a8._4_4_ + (float)local_468._4_4_ * (float)local_458._4_4_ +
                   fStack_7e4 + (float)local_818._4_4_;
          fVar13 = (float)uStack_7f0 * (float)local_688._0_4_ +
                   (float)uStack_690 * fStack_440 +
                   fStack_6a0 + (float)vStack_460.m_value * fStack_450 + fStack_7e0 + fStack_810;
          fVar12 = fStack_48c + fStack_494 + fStack_490 + local_498;
          fVar14 = fStack_47c + fStack_484 + fStack_480 + local_488;
          fVar15 = fStack_46c + fStack_474 + fStack_470 + local_478;
          fVar11 = fVar13 * fVar15 + fVar10 * fVar14 + fVar12 * fVar16;
          fVar16 = fVar16 - fVar12 * fVar11;
          fVar10 = fVar10 - fVar14 * fVar11;
          fVar13 = fVar13 - fVar11 * fVar15;
          fVar11 = fVar13 * fVar13 + fVar10 * fVar10 + fVar16 * fVar16;
          fVar12 = *stack0xfffffffffffff9a0;
          fVar13 = stack0xfffffffffffff9a0[1];
          fVar14 = stack0xfffffffffffff9a0[2];
          fVar15 = stack0xfffffffffffff9a0[3];
          if (0.0 < fVar11) {
            fVar16 = fVar16 / SQRT(fVar11);
          }
          local_7f8._4_4_ = (float)local_7d8._4_4_ * fVar13;
          local_7f8._0_4_ = (float)local_7d8._0_4_ * fVar12;
          uStack_7f0._0_4_ = (float)local_7d8._8_4_ * fVar14;
          uStack_7f0._4_4_ = (float)local_7d8._12_4_ * fVar15;
          local_688._4_4_ = (float)local_7d8._20_4_ * fVar13;
          local_688._0_4_ = (float)local_7d8._16_4_ * fVar12;
          fStack_680 = (float)uStack_7c0 * fVar14;
          fStack_67c = uStack_7c0._4_4_ * fVar15;
          _local_7e8 = CONCAT44(fVar13 * local_7b8[1],fVar12 * local_7b8[0]);
          _fStack_7e0 = CONCAT44(fVar15 * local_7b8[3],fVar14 * local_7b8[2]);
          local_788 = local_798;
          fVar12 = atan2f((float)(~-(uint)(0.0 < fVar11) & (uint)fVar10 |
                                 (uint)(fVar10 / SQRT(fVar11)) & -(uint)(0.0 < fVar11)),fVar16);
          local_818._0_4_ = fVar12;
          fVar12 = cosf(fVar12);
          local_7d8._8_4_ = 0.0;
          local_7d8._12_4_ = 0.0;
          local_7d8._16_4_ = 1.4013e-45;
          local_7d8._20_4_ = 0.0;
          uStack_7c0 = (Matrix<float,_4,_4,_1,_4,_4> *)0x1;
          local_110[0] = (Matrix<float,_4,_4,_0,_4,_4> *)CONCAT44(local_110[0]._4_4_,fVar12);
          local_7d8._0_8_ = pfVar8;
          fVar12 = sinf((float)local_818._0_4_);
          local_668._0_4_ = fVar12;
          pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_7d8,
                              (Scalar *)local_668);
          local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
          pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar5,(Scalar *)local_2b8);
          fVar12 = sinf((float)local_818._0_4_);
          local_188.m_lhs.m_lhs.m_lhs.m_lhs.m_lhs.m_xpr =
               (XprTypeNested)
               (CONCAT44(local_188.m_lhs.m_lhs.m_lhs.m_lhs.m_lhs.m_xpr._4_4_,fVar12) ^ 0x80000000);
          pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar5,(Scalar *)&local_188);
          local_ec[0] = cosf((float)local_818._0_4_);
          s.m_matrix = (non_const_type)local_ec;
          pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar5,(Scalar *)s.m_matrix);
          local_82c = 0.0;
          pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar5,&local_82c);
          local_73c = 0.0;
          pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar5,&local_73c);
          local_740 = 0.0;
          pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar5,&local_740);
          local_744 = 1.0;
          Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                    (pCVar5,&local_744);
          local_668._0_8_ = (non_const_type)CONCAT44(local_668._4_4_,local_668._0_4_);
          if (((long)&(((SrcXprType *)uStack_7c0)->m_xpr).m_matrix +
               CONCAT44(local_7d8._12_4_,local_7d8._8_4_) == 3) &&
             (local_668._0_8_ = (non_const_type)CONCAT44(local_668._4_4_,local_668._0_4_),
             CONCAT44(local_7d8._20_4_,local_7d8._16_4_) == 3)) {
            fVar13 = (float)local_4b8._0_4_ * (float)local_5f8._0_4_ +
                     (float)local_4c8._0_4_ * local_4a8 +
                     local_4d8 + (float)local_4e8 * (float)local_608._0_4_ + (float)local_678 +
                     (float)local_828._0_4_;
            fVar14 = (float)local_4b8._4_4_ * (float)local_5f8._0_4_ +
                     (float)local_4c8._4_4_ * fStack_4a4 +
                     fStack_4d4 + local_4e8._4_4_ * (float)local_608._4_4_ + local_678._4_4_ +
                     (float)local_828._4_4_;
            fVar15 = (float)uStack_4b0 * (float)local_5f8._0_4_ +
                     (float)uStack_4c0 * fStack_4a0 +
                     fStack_4d0 + (float)uStack_4e0 * fStack_600 + (float)uStack_670 + fStack_820;
            fVar12 = uStack_7f0._4_4_ + (float)local_7f8._4_4_ +
                     (float)uStack_7f0 + (float)local_7f8._0_4_;
            fVar10 = fStack_67c + (float)local_688._4_4_ + fStack_680 + (float)local_688._0_4_;
            fVar16 = fStack_7dc + fStack_7e4 + fStack_7e0 + local_7e8;
            local_7d8._0_4_ = 1.0;
            local_7d8._4_4_ = 0.0;
            local_7d8._8_4_ = 0.0;
            local_7d8._12_4_ = 0.0;
            local_7d8._16_4_ = 0.0;
            local_7d8._20_4_ = 1.0;
            uStack_7c0 = (Matrix<float,_4,_4,_1,_4,_4> *)0x0;
            local_7b8[0] = 0.0;
            local_7b8[1] = 0.0;
            local_7b8[2] = 1.0;
            local_7b8[3] = 0.0;
            local_7b8[4] = 0.0;
            local_7b8[5] = 0.0;
            local_7b8[6] = 0.0;
            local_7b8[7] = 1.0;
            lVar6 = 0;
            do {
              *(float *)(local_7d8 + lVar6 + 8) = pfVar8[2];
              *(Matrix<float,_4,_4,_0,_4,_4> **)(local_7d8 + lVar6) =
                   *(Matrix<float,_4,_4,_0,_4,_4> **)pfVar8;
              pfVar8 = pfVar8 + 3;
              lVar6 = lVar6 + 0x10;
            } while (lVar6 != 0x30);
            fVar11 = fVar15 * fVar16 + fVar14 * fVar10 + fVar13 * fVar12;
            fVar13 = fVar13 - fVar12 * fVar11;
            fVar14 = fVar14 - fVar10 * fVar11;
            fVar15 = fVar15 - fVar11 * fVar16;
            fVar12 = fVar15 * fVar15 + fVar14 * fVar14 + fVar13 * fVar13;
            if (0.0 < fVar12) {
              fVar13 = fVar13 / SQRT(fVar12);
            }
            fVar12 = atan2f((float)(~-(uint)(0.0 < fVar12) & (uint)fVar14 |
                                   (uint)(fVar14 / SQRT(fVar12)) & -(uint)(0.0 < fVar12)),fVar13);
            local_828._0_4_ = fVar12;
            local_ec[0] = cosf(fVar12);
            local_668._8_4_ = 0.0;
            fStack_65c = 0.0;
            fStack_658 = 1.4013e-45;
            fStack_654 = 0.0;
            local_650 = 1;
            local_668._0_8_ = s.m_matrix;
            fVar12 = sinf((float)local_828._0_4_);
            local_2b8._0_4_ = fVar12;
            pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                               ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_668,
                                (Scalar *)local_2b8);
            local_188.m_lhs.m_lhs.m_lhs.m_lhs.m_lhs.m_xpr =
                 (XprTypeNested)
                 ((ulong)local_188.m_lhs.m_lhs.m_lhs.m_lhs.m_lhs.m_xpr & 0xffffffff00000000);
            pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar5,(Scalar *)&local_188);
            local_82c = sinf((float)local_828._0_4_);
            local_82c = -local_82c;
            pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar5,&local_82c);
            local_73c = cosf((float)local_828._0_4_);
            pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar5,&local_73c);
            local_740 = 0.0;
            pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar5,&local_740);
            local_744 = 0.0;
            pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar5,&local_744);
            local_41c = 0.0;
            pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar5,&local_41c);
            local_420 = 1.0;
            Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar5,&local_420);
            local_7d8._0_8_ =
                 (Matrix<float,_3,_3,_0,_3,_3> *)CONCAT44(local_7d8._4_4_,local_7d8._0_4_);
            if ((local_650 + (long)unique0x10003184 == 3) &&
               (local_7d8._0_8_ =
                     (Matrix<float,_3,_3,_0,_3,_3> *)CONCAT44(local_7d8._4_4_,local_7d8._0_4_),
               CONCAT44(fStack_654,fStack_658) == 3)) {
              local_668._0_4_ = 1.0;
              local_668._4_4_ = 0.0;
              local_668._8_4_ = 0.0;
              fStack_65c = 0.0;
              fStack_658 = 0.0;
              fStack_654 = 1.0;
              local_650 = 0;
              afStack_648[0] = 0.0;
              afStack_648[1] = 0.0;
              afStack_648[2] = 1.0;
              afStack_648[3] = 0.0;
              afStack_648[4] = 0.0;
              afStack_648[5] = 0.0;
              afStack_648[6] = 0.0;
              afStack_648[7] = 1.0;
              lVar6 = 0;
              do {
                *(float *)(local_668 + lVar6 + 8) = *(float *)((long)s.m_matrix + 8);
                *(undefined8 *)(local_668 + lVar6) = *(undefined8 *)s.m_matrix;
                s.m_matrix = (non_const_type)((long)s.m_matrix + 0xc);
                lVar6 = lVar6 + 0x10;
              } while (lVar6 != 0x30);
              local_188.m_lhs.m_lhs.m_lhs.m_lhs.m_lhs.m_xpr = &local_268;
              local_188.m_lhs.m_lhs.m_lhs.m_lhs.m_rhs.m_xpr = &local_2f8;
              local_188.m_rhs = &local_158;
              local_188.m_lhs.m_lhs.m_lhs.m_rhs.m_xpr = (XprTypeNested)local_668;
              local_188.m_lhs.m_lhs.m_rhs = (RhsNested)local_7d8;
              local_188.m_lhs.m_rhs = (non_const_type)&local_5b8;
              Eigen::internal::
              call_dense_assignment_loop<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,1>,Eigen::internal::assign_op<float,float>>
                        ((Matrix<float,_4,_4,_0,_4,_4> *)local_2b8,&local_188,
                         (assign_op<float,_float> *)&local_82c);
              __position._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                          ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                            *)__return_storage_ptr__,__position,
                           (Matrix<float,_4,_4,_0,_4,_4> *)local_2b8);
              }
              else {
                *(float (*) [2])
                 (((__position._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                  array + 0xc) = local_288;
                *(float (*) [2])
                 (((__position._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                  array + 0xe) = afStack_280;
                *(float (*) [2])
                 (((__position._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                  array + 8) = local_298;
                *(float (*) [2])
                 (((__position._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                  array + 10) = afStack_290;
                *(assign_op<float,_float> **)
                 (((__position._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                  array + 4) = local_2a8;
                *(assign_op<float,_float> **)
                 (((__position._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                  array + 6) = paStack_2a0;
                *(undefined8 *)
                 ((__position._M_current)->
                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
                     = local_2b8._0_8_;
                *(undefined8 *)
                 (((__position._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                  array + 2) = local_2b8._8_8_;
                (__return_storage_ptr__->
                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              if (local_620.
                  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_620.
                                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_620.
                                      super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_620.
                                      super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              goto LAB_001ac482;
            }
          }
          __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                        ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                        "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 3>>::finished() [MatrixType = Eigen::Matrix<float, 3, 3>]"
                       );
        }
      }
    }
  }
  local_6f0 = dst;
  __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                "Eigen::internal::block_evaluator<const Eigen::Matrix<float, 4, 1>, 4, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<float, 4, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
               );
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M1P(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){

	// check input vectors size
	if(lCPair.size() < 1 && plPair.size() < 2){
		std::cerr << "Solver 1M1P requires at least 1 line and 1 plane correspondence!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;
	out.clear();

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu;
	Pi = plPair[0].first; Nu = plPair[0].second;
	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);

	// check if line and plane are parallel
	if(abs(Pi.head(3).dot(lines1[0].head(3))) < 1e-6){
		// std::cout << Pi.head(3).transpose() << "   " << lines1[0].head(3).transpose() << std::endl; 
		// std::cout << lCPair[0].first.second.head(3).transpose() << "  " << lCPair[0].first.first.head(3).transpose() << std::endl;
		// std::cerr << "Solver 1M1P: The line and plane cannot be parallel!" << std::endl;
		return out;
		// exit(-1);
	}

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TU2 = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU1 = predTrans.back();
	predTrans.pop_back();

	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,4,1> PiU = TU1.transpose().inverse()*Pi;
	Eigen::Matrix<floatPrec,4,1> NuU = TU2.transpose().inverse()*Nu;
	
	// get direction and moment vectors
	Eigen::Matrix<floatPrec,3,1> dir1 = lU1.head(3), m1 = lU1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lU2.head(3), m2 = lU2.tail(3);
	Eigen::Matrix<floatPrec,3,1> n1 = PiU.head(3), n2 = NuU.head(3);

	// compute intersection line with plane
	Eigen::Matrix<floatPrec,3,1> p1 = (n1.cross(m1) - PiU(3)*dir1)/(n1.dot(dir1));
	Eigen::Matrix<floatPrec,3,1> p2 = (n2.cross(m2) - NuU(3)*dir2)/(n2.dot(dir2));

	Matrix<floatPrec, 4, 4> Tu1 = Matrix<floatPrec, 4, 4>::Identity();
	Tu1.topRightCorner(3,1) = p1;
	Matrix<floatPrec, 4, 4> Tu2 = Matrix<floatPrec, 4, 4>::Identity();
	Tu2.topRightCorner(3,1) = p2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(p1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(p2);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*lU1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*lU2;
	Eigen::Matrix<floatPrec,4,1> Piu = Tu1.transpose().inverse()*PiU;
	Eigen::Matrix<floatPrec,4,1> Nuu = Tu2.transpose().inverse()*NuU;

	// align x axis wiht projection of line direction to plane
	// project line direction to plane
	dir1 = lu1.head(3); m1 = lu1.tail(3);
	dir2 = lu2.head(3); m2 = lu2.tail(3);
	n1 = Piu.head(3); n2 = Nuu.head(3);
	// frame A
	Eigen::Matrix<floatPrec,3,1> w = (dir1 - dir1.dot(n1)*n1).normalized();
	floatPrec alpha1 = atan2(w(1),w(0));
	Eigen::Matrix<floatPrec,3,3> V1;
	V1 << cos(alpha1),sin(alpha1),0,-sin(alpha1),cos(alpha1),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV1.topLeftCorner(3,3) = V1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> w2 = (dir2 - dir2.dot(n2)*n2).normalized();
	floatPrec alpha2 = atan2(w2(1),w2(0));
	Eigen::Matrix<floatPrec,3,3> V2;
	V2 << cos(alpha2),sin(alpha2),0,-sin(alpha2),cos(alpha2),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV2.topLeftCorner(3,3) = V2;

	Eigen::Matrix<floatPrec,4,4> sol = TU2.inverse()*Tu2.inverse()*TV2.inverse()*TV1*Tu1*TU1;
	out.push_back(sol);

	return out;
}